

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

Vec3fa embree::getVec3fa(char **token)

{
  size_t sVar1;
  long *in_RSI;
  char **in_RDI;
  float fVar2;
  float fVar3;
  Vec3fa VVar4;
  float z;
  float y;
  float x;
  
  VVar4.field_0._0_4_ = getFloat(in_RDI);
  sVar1 = strspn((char *)*in_RSI," \t");
  *in_RSI = sVar1 + *in_RSI;
  if (*(char *)*in_RSI == '\0') {
    *(float *)in_RDI = VVar4.field_0._0_4_;
    *(float *)((long)in_RDI + 4) = VVar4.field_0._0_4_;
    *(float *)(in_RDI + 1) = VVar4.field_0._0_4_;
    *(undefined4 *)((long)in_RDI + 0xc) = 0;
    fVar2 = VVar4.field_0._0_4_;
    fVar3 = VVar4.field_0._0_4_;
  }
  else {
    fVar2 = getFloat(in_RDI);
    fVar3 = getFloat(in_RDI);
    *(float *)in_RDI = VVar4.field_0._0_4_;
    *(float *)((long)in_RDI + 4) = fVar2;
    *(float *)(in_RDI + 1) = fVar3;
    *(float *)((long)in_RDI + 0xc) = 0.0;
  }
  VVar4.field_0.m128[1] = fVar2;
  VVar4.field_0.m128[2] = fVar3;
  VVar4.field_0.m128[3] = 0.0;
  return (Vec3fa)VVar4.field_0;
}

Assistant:

static inline Vec3fa getVec3fa(const char*& token) {
    float x = getFloat(token);
    token += strspn(token, " \t");
    if (*token == 0) return Vec3f(x);
    float y = getFloat(token);
    float z = getFloat(token);
    return Vec3fa(x,y,z);
  }